

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi_DDS_aug_c.h
# Opt level: O3

int stbi_dds_test_file(FILE *f)

{
  int iVar1;
  long lVar2;
  stbi s;
  stbi local_40;
  
  lVar2 = ftell((FILE *)f);
  local_40.img_file = f;
  iVar1 = dds_test(&local_40);
  fseek((FILE *)f,(long)(int)lVar2,0);
  return iVar1;
}

Assistant:

int      stbi_dds_test_file        (FILE *f)
{
   stbi s;
   int r,n = ftell(f);
   start_file(&s,f);
   r = dds_test(&s);
   fseek(f,n,SEEK_SET);
   return r;
}